

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimizer_engine.cpp
# Opt level: O2

void __thiscall
ram::MinimizerEngine::MinimizerEngine
          (MinimizerEngine *this,shared_ptr<thread_pool::ThreadPool> *thread_pool,uint32_t k,
          uint32_t w,uint32_t bandwidth,uint32_t chain,uint32_t matches,uint32_t gap)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  allocator_type local_1d;
  undefined4 local_1c;
  
  uVar2 = k + (k == 0);
  uVar3 = 0x1f;
  if (uVar2 < 0x1f) {
    uVar3 = uVar2;
  }
  this->k_ = uVar3;
  this->w_ = w;
  this->bandwidth_ = bandwidth;
  this->chain_ = chain;
  this->matches_ = matches;
  this->gap_ = (ulong)gap;
  this->occurrence_ = 0xffffffff;
  bVar1 = 0xe;
  if (uVar3 * 2 < 0xe) {
    bVar1 = (byte)(uVar3 * 2);
  }
  std::vector<ram::MinimizerEngine::Index,_std::allocator<ram::MinimizerEngine::Index>_>::vector
            (&this->index_,(ulong)(uint)(1 << (bVar1 & 0x1f)),&local_1d);
  if ((thread_pool->super___shared_ptr<thread_pool::ThreadPool,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
      == (element_type *)0x0) {
    local_1c = 1;
    std::make_shared<thread_pool::ThreadPool,int>((int *)&this->thread_pool_);
  }
  else {
    std::__shared_ptr<thread_pool::ThreadPool,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&(this->thread_pool_).
                super___shared_ptr<thread_pool::ThreadPool,_(__gnu_cxx::_Lock_policy)2>,
               &thread_pool->super___shared_ptr<thread_pool::ThreadPool,_(__gnu_cxx::_Lock_policy)2>
              );
  }
  return;
}

Assistant:

MinimizerEngine::MinimizerEngine(
    std::shared_ptr<thread_pool::ThreadPool> thread_pool,
    std::uint32_t k,
    std::uint32_t w,
    std::uint32_t bandwidth,
    std::uint32_t chain,
    std::uint32_t matches,
    std::uint32_t gap)
    : k_(std::min(std::max(k, 1U), 31U)),
      w_(w),
      bandwidth_(bandwidth),
      chain_(chain),
      matches_(matches),
      gap_(gap),
      occurrence_(-1),
      index_(1U << std::min(14U, 2 * k_)),
      thread_pool_(thread_pool ?
          thread_pool :
          std::make_shared<thread_pool::ThreadPool>(1)) {}